

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermReader.h
# Opt level: O2

void aeron::concurrent::logbuffer::TermReader::
     read<std::function<void(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>&>
               (ReadOutcome *outcome,AtomicBuffer *termBuffer,int32_t termOffset,
               function<void_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
               *handler,int fragmentsLimit,Header *header,exception_handler_t *exceptionHandler)

{
  length_t lVar1;
  uint16_t uVar2;
  int iVar3;
  int32_t iVar4;
  int iVar5;
  
  outcome->fragmentsRead = 0;
  outcome->offset = termOffset;
  lVar1 = termBuffer->m_length;
  iVar3 = 0;
  while ((iVar3 < fragmentsLimit && (termOffset < (int)lVar1))) {
    iVar4 = AtomicBuffer::getInt32Volatile(termBuffer,termOffset);
    if (iVar4 < 1) break;
    iVar5 = (iVar4 + 0x1fU & 0xffffffe0) + termOffset;
    uVar2 = AtomicBuffer::getUInt16(termBuffer,termOffset + 6);
    if (uVar2 == 0) {
      iVar3 = outcome->fragmentsRead;
      termOffset = iVar5;
    }
    else {
      (header->m_buffer).m_buffer = termBuffer->m_buffer;
      (header->m_buffer).m_length = termBuffer->m_length;
      header->m_offset = termOffset;
      std::
      function<void_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
      ::operator()(handler,termBuffer,termOffset + 0x20,iVar4 + -0x20,header);
      iVar3 = outcome->fragmentsRead + 1;
      outcome->fragmentsRead = iVar3;
      termOffset = iVar5;
    }
  }
  outcome->offset = termOffset;
  return;
}

Assistant:

inline void read(
    ReadOutcome& outcome,
    AtomicBuffer& termBuffer,
    std::int32_t termOffset,
    F&& handler,
    int fragmentsLimit,
    Header& header,
    const exception_handler_t & exceptionHandler)
{
    outcome.fragmentsRead = 0;
    outcome.offset = termOffset;
    const util::index_t capacity = termBuffer.capacity();

    try
    {
        while (outcome.fragmentsRead < fragmentsLimit && termOffset < capacity)
        {
            const std::int32_t frameLength = FrameDescriptor::frameLengthVolatile(termBuffer, termOffset);
            if (frameLength <= 0)
            {
                break;
            }

            const std::int32_t fragmentOffset = termOffset;
            termOffset += util::BitUtil::align(frameLength, FrameDescriptor::FRAME_ALIGNMENT);

            if (!FrameDescriptor::isPaddingFrame(termBuffer, fragmentOffset))
            {
                header.buffer(termBuffer);
                header.offset(fragmentOffset);
                handler(termBuffer, fragmentOffset + DataFrameHeader::LENGTH, frameLength - DataFrameHeader::LENGTH, header);

                ++outcome.fragmentsRead;
            }
        }
    }
    catch (const std::exception& ex)
    {
        exceptionHandler(ex);
    }

    outcome.offset = termOffset;
}